

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O1

wchar_t archive_mstring_copy_wcs(archive_mstring *aes,wchar_t *wcs)

{
  size_t n;
  
  if (wcs == (wchar_t *)0x0) {
    aes->aes_set = L'\0';
  }
  else {
    n = wcslen(wcs);
    aes->aes_set = L'\x04';
    (aes->aes_mbs).length = 0;
    (aes->aes_utf8).length = 0;
    (aes->aes_wcs).length = 0;
    archive_wstrncat(&aes->aes_wcs,wcs,n);
  }
  return L'\0';
}

Assistant:

int
archive_mstring_copy_wcs(struct archive_mstring *aes, const wchar_t *wcs)
{
	return archive_mstring_copy_wcs_len(aes, wcs,
				wcs == NULL ? 0 : wcslen(wcs));
}